

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

int secp256k1_scalar_cond_negate(secp256k1_scalar *r,int flag)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  uint64_t uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  int vflag;
  
  lVar11 = (long)flag;
  uVar1 = r->d[3];
  uVar10 = 0;
  uVar9 = -lVar11;
  uVar13 = r->d[0] ^ uVar9;
  uVar12 = r->d[1] ^ uVar9;
  uVar14 = r->d[2] ^ uVar9;
  uVar2 = (ulong)CARRY8(uVar9 & 0xbfd25e8cd0364142,uVar13);
  uVar3 = (uVar9 & 0xbaaedce6af48a03b) + uVar12;
  uVar12 = (ulong)(CARRY8(uVar9 & 0xbaaedce6af48a03b,uVar12) || CARRY8(uVar3,uVar2));
  uVar4 = (uVar9 & 0xfffffffffffffffe) + uVar14;
  bVar7 = r->d[1] == 0;
  bVar8 = r->d[0] == 0;
  bVar6 = r->d[2] == 0;
  bVar5 = uVar1 == 0;
  uVar16 = (uVar9 & 0xbfd25e8cd0364142) + uVar13;
  if (((bVar7 && bVar8) && bVar6) && bVar5) {
    uVar16 = uVar10;
  }
  r->d[0] = uVar16;
  uVar16 = uVar3 + uVar2;
  if (((bVar7 && bVar8) && bVar6) && bVar5) {
    uVar16 = uVar10;
  }
  r->d[1] = uVar16;
  uVar15 = ((uVar1 ^ uVar9) - lVar11) +
           (ulong)(CARRY8(uVar9 & 0xfffffffffffffffe,uVar14) || CARRY8(uVar4,uVar12));
  uVar16 = uVar4 + uVar12;
  if (((bVar7 && bVar8) && bVar6) && bVar5) {
    uVar15 = uVar10;
    uVar16 = uVar10;
  }
  r->d[2] = uVar16;
  r->d[3] = uVar15;
  return -(uint)(lVar11 != 0) | 1;
}

Assistant:

static int secp256k1_scalar_cond_negate(secp256k1_scalar *r, int flag) {
    /* If we are flag = 0, mask = 00...00 and this is a no-op;
     * if we are flag = 1, mask = 11...11 and this is identical to secp256k1_scalar_negate */
    volatile int vflag = flag;
    uint64_t mask = -vflag;
    uint64_t nonzero = (secp256k1_scalar_is_zero(r) != 0) - 1;
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(r);

    secp256k1_u128_from_u64(&t, r->d[0] ^ mask);
    secp256k1_u128_accum_u64(&t, (SECP256K1_N_0 + 1) & mask);
    r->d[0] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_1 & mask);
    r->d[1] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_2 & mask);
    r->d[2] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_3 & mask);
    r->d[3] = secp256k1_u128_to_u64(&t) & nonzero;

    SECP256K1_SCALAR_VERIFY(r);
    return 2 * (mask == 0) - 1;
}